

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabbox3d.h
# Opt level: O0

void __thiscall irr::core::aabbox3d<float>::getEdges(aabbox3d<float> *this,vector3d<float> *edges)

{
  vector3d<float> *in_RSI;
  vector3d<float> vVar1;
  vector3d<float> diag;
  vector3d<float> middle;
  undefined4 in_stack_ffffffffffffffb8;
  float fVar2;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  float fVar3;
  float fStack_38;
  undefined8 local_30;
  float local_28;
  aabbox3d<float> *in_stack_ffffffffffffffe0;
  
  vVar1 = getCenter(in_stack_ffffffffffffffe0);
  local_28 = vVar1.Z;
  local_30 = vVar1._0_8_;
  vVar1 = vector3d<float>::operator-
                    ((vector3d<float> *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (vector3d<float> *)
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  fVar2 = vVar1.Z;
  fVar3 = vVar1.X;
  fStack_38 = vVar1.Y;
  vector3d<float>::set
            (in_RSI,(float)local_30 + fVar3,(float)((ulong)local_30 >> 0x20) + fStack_38,
             local_28 + fVar2);
  vector3d<float>::set
            (in_RSI + 1,(float)local_30 + fVar3,(float)((ulong)local_30 >> 0x20) - fStack_38,
             local_28 + fVar2);
  vector3d<float>::set
            (in_RSI + 2,(float)local_30 + fVar3,(float)((ulong)local_30 >> 0x20) + fStack_38,
             local_28 - fVar2);
  vector3d<float>::set
            (in_RSI + 3,(float)local_30 + fVar3,(float)((ulong)local_30 >> 0x20) - fStack_38,
             local_28 - fVar2);
  vector3d<float>::set
            (in_RSI + 4,(float)local_30 - fVar3,(float)((ulong)local_30 >> 0x20) + fStack_38,
             local_28 + fVar2);
  vector3d<float>::set
            (in_RSI + 5,(float)local_30 - fVar3,(float)((ulong)local_30 >> 0x20) - fStack_38,
             local_28 + fVar2);
  vector3d<float>::set
            (in_RSI + 6,(float)local_30 - fVar3,(float)((ulong)local_30 >> 0x20) + fStack_38,
             local_28 - fVar2);
  vector3d<float>::set
            (in_RSI + 7,(float)local_30 - fVar3,(float)((ulong)local_30 >> 0x20) - fStack_38,
             local_28 - fVar2);
  return;
}

Assistant:

void getEdges(vector3d<T> *edges) const
	{
		const core::vector3d<T> middle = getCenter();
		const core::vector3d<T> diag = middle - MaxEdge;

		/*
		Edges are stored in this way:
		Hey, am I an ascii artist, or what? :) niko.
			   /3--------/7
			  / |       / |
			 /  |      /  |
			1---------5   |
			|  /2- - -|- -6
			| /       |  /
			|/        | /
			0---------4/
		*/

		edges[0].set(middle.X + diag.X, middle.Y + diag.Y, middle.Z + diag.Z);
		edges[1].set(middle.X + diag.X, middle.Y - diag.Y, middle.Z + diag.Z);
		edges[2].set(middle.X + diag.X, middle.Y + diag.Y, middle.Z - diag.Z);
		edges[3].set(middle.X + diag.X, middle.Y - diag.Y, middle.Z - diag.Z);
		edges[4].set(middle.X - diag.X, middle.Y + diag.Y, middle.Z + diag.Z);
		edges[5].set(middle.X - diag.X, middle.Y - diag.Y, middle.Z + diag.Z);
		edges[6].set(middle.X - diag.X, middle.Y + diag.Y, middle.Z - diag.Z);
		edges[7].set(middle.X - diag.X, middle.Y - diag.Y, middle.Z - diag.Z);
	}